

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

void duckdb::BinaryExecutor::
     ExecuteGenericLoop<duckdb::interval_t,duckdb::dtime_tz_t,duckdb::dtime_tz_t,duckdb::BinaryStandardOperatorWrapper,duckdb::AddTimeOperator,bool>
               (interval_t *ldata,dtime_tz_t *rdata,dtime_tz_t *result_data,SelectionVector *lsel,
               SelectionVector *rsel,idx_t count,ValidityMask *lvalidity,ValidityMask *rvalidity,
               ValidityMask *result_validity,bool fun)

{
  interval_t left;
  interval_t left_00;
  bool bVar1;
  dtime_tz_t dVar2;
  idx_t iVar3;
  idx_t *piVar4;
  idx_t iVar5;
  SelectionVector *in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  SelectionVector *in_R8;
  ulong in_R9;
  TemplatedValidityMask<unsigned_long> *in_stack_00000008;
  TemplatedValidityMask<unsigned_long> *in_stack_00000010;
  dtime_tz_t rentry_1;
  interval_t lentry_1;
  idx_t i_1;
  dtime_tz_t rentry;
  interval_t lentry;
  idx_t rindex;
  idx_t lindex;
  idx_t i;
  idx_t in_stack_ffffffffffffff28;
  long lVar6;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffff30;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffff38;
  idx_t in_stack_ffffffffffffff40;
  ValidityMask *in_stack_ffffffffffffff48;
  dtime_tz_t in_stack_ffffffffffffff50;
  undefined1 fun_00;
  dtime_tz_t in_stack_ffffffffffffff58;
  undefined8 in_stack_ffffffffffffff60;
  int64_t in_stack_ffffffffffffff68;
  ValidityMask *mask;
  ulong local_90;
  ulong local_40;
  
  bVar1 = TemplatedValidityMask<unsigned_long>::AllValid(in_stack_00000008);
  if ((bVar1) && (bVar1 = TemplatedValidityMask<unsigned_long>::AllValid(in_stack_00000010), bVar1))
  {
    for (local_90 = 0; fun_00 = (undefined1)(in_stack_ffffffffffffff50.bits >> 0x38),
        local_90 < in_R9; local_90 = local_90 + 1) {
      lVar6 = in_RDI;
      iVar3 = SelectionVector::get_index(in_RCX,local_90);
      piVar4 = (idx_t *)(lVar6 + iVar3 * 0x10);
      iVar3 = *piVar4;
      mask = (ValidityMask *)piVar4[1];
      lVar6 = in_RSI;
      iVar5 = SelectionVector::get_index(in_R8,local_90);
      left_00.micros = (int64_t)mask;
      left_00.months = (int)iVar3;
      left_00.days = (int)(iVar3 >> 0x20);
      in_stack_ffffffffffffff50 =
           BinaryStandardOperatorWrapper::
           Operation<bool,duckdb::AddTimeOperator,duckdb::interval_t,duckdb::dtime_tz_t,duckdb::dtime_tz_t>
                     ((bool)fun_00,left_00,*(uint64_t *)(lVar6 + iVar5 * 8),mask,iVar3);
      *(uint64_t *)(in_RDX + local_90 * 8) = in_stack_ffffffffffffff50.bits;
    }
  }
  else {
    for (local_40 = 0; local_40 < in_R9; local_40 = local_40 + 1) {
      SelectionVector::get_index(in_RCX,local_40);
      SelectionVector::get_index(in_R8,local_40);
      bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (in_stack_ffffffffffffff38,(idx_t)in_stack_ffffffffffffff30);
      if ((bVar1) &&
         (bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                            (in_stack_ffffffffffffff38,(idx_t)in_stack_ffffffffffffff30), bVar1)) {
        left.micros = in_stack_ffffffffffffff68;
        left.months = (int)in_stack_ffffffffffffff60;
        left.days = (int)((ulong)in_stack_ffffffffffffff60 >> 0x20);
        dVar2 = BinaryStandardOperatorWrapper::
                Operation<bool,duckdb::AddTimeOperator,duckdb::interval_t,duckdb::dtime_tz_t,duckdb::dtime_tz_t>
                          (SUB81(in_stack_ffffffffffffff50.bits >> 0x38,0),left,
                           in_stack_ffffffffffffff58,in_stack_ffffffffffffff48,
                           in_stack_ffffffffffffff40);
        *(uint64_t *)(in_RDX + local_40 * 8) = dVar2.bits;
      }
      else {
        TemplatedValidityMask<unsigned_long>::SetInvalid
                  (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      }
    }
  }
  return;
}

Assistant:

static void ExecuteGenericLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                               RESULT_TYPE *__restrict result_data, const SelectionVector *__restrict lsel,
	                               const SelectionVector *__restrict rsel, idx_t count, ValidityMask &lvalidity,
	                               ValidityMask &rvalidity, ValidityMask &result_validity, FUNC fun) {
		if (!lvalidity.AllValid() || !rvalidity.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto lindex = lsel->get_index(i);
				auto rindex = rsel->get_index(i);
				if (lvalidity.RowIsValid(lindex) && rvalidity.RowIsValid(rindex)) {
					auto lentry = ldata[lindex];
					auto rentry = rdata[rindex];
					result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
					    fun, lentry, rentry, result_validity, i);
				} else {
					result_validity.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[lsel->get_index(i)];
				auto rentry = rdata[rsel->get_index(i)];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, result_validity, i);
			}
		}
	}